

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void __thiscall
spatial_region::add_beam
          (spatial_region *this,double cmr,double n0,double u0,double xb,double rb,double x0b,
          double y0b,double phib)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  celle *pcVar11;
  cellb *pcVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ulong in_XMM3_Qb;
  double dVar65;
  undefined8 in_XMM4_Qb;
  ulong in_XMM5_Qb;
  ulong in_XMM6_Qb;
  undefined8 in_XMM8_Qb;
  undefined1 local_188 [16];
  undefined1 local_148 [16];
  int_vector3d local_114;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  ulong uStack_b0;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int_vector3d local_78;
  double local_68;
  double dStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  
  local_78.i = this->xnpic;
  local_78.j = this->ynpic;
  local_78.k = this->znpic;
  iVar35 = this->nx;
  if (0 < iVar35) {
    auVar39._8_8_ = in_XMM3_Qb;
    auVar39._0_8_ = xb;
    dVar65 = (double)(int)((uint)(0.0 < cmr) - (uint)(cmr < 0.0));
    lVar34 = 0;
    iVar32 = this->ny;
    local_b8 = -y0b;
    uStack_b0 = in_XMM6_Qb ^ 0x8000000000000000;
    local_c8 = -x0b;
    uStack_c0 = in_XMM5_Qb ^ 0x8000000000000000;
    local_48 = -xb;
    uStack_40 = in_XMM3_Qb ^ 0x8000000000000000;
    auVar14._8_8_ = in_XMM4_Qb;
    auVar14._0_8_ = rb;
    dVar13 = dVar65 * (double)(int)((uint)(0.0 < u0) - (uint)(u0 < 0.0));
    auVar14 = vunpcklpd_avx(auVar39,auVar14);
    local_68 = auVar14._0_8_ * auVar14._0_8_;
    dStack_60 = auVar14._8_8_ * auVar14._8_8_;
    local_a0 = n0 * 0.25;
    local_90 = n0 * 0.5;
    local_98 = (rb + rb) * rb;
    local_f8 = rb;
    local_88 = cmr;
    local_58 = xb;
    uStack_50 = in_XMM3_Qb;
    do {
      if (0 < iVar32) {
        uVar38 = (ulong)(uint)this->nz;
        dVar40 = (double)(int)lVar34;
        lVar36 = 0;
        do {
          if (0 < (int)uVar38) {
            lVar33 = 0;
            lVar37 = 0;
            do {
              iVar35 = (int)lVar36;
              auVar26._8_8_ = uStack_b0;
              auVar26._0_8_ = local_b8;
              auVar23._8_8_ = uStack_c0;
              auVar23._0_8_ = local_c8;
              auVar44._0_8_ = (double)(iVar35 - this->ny / 2);
              auVar44._8_8_ = in_XMM8_Qb;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = this->dy;
              auVar14 = vfmadd132sd_fma(auVar44,auVar26,auVar1);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = this->dx;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = dVar40;
              auVar39 = vfmadd132sd_fma(auVar56,auVar23,auVar2);
              local_114.i = (int)lVar34;
              local_114.j = iVar35;
              local_114.k = (int)lVar37;
              dVar41 = atan2(auVar14._0_8_,auVar39._0_8_);
              auVar57._8_8_ = 0;
              auVar57._0_8_ = this->dx;
              auVar24._8_8_ = uStack_c0;
              auVar24._0_8_ = local_c8;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = dVar40;
              auVar14 = vfmadd132sd_fma(auVar57,auVar24,auVar3);
              auVar27._8_8_ = uStack_b0;
              auVar27._0_8_ = local_b8;
              auVar63._0_8_ = (double)(iVar35 - this->ny / 2);
              auVar63._8_8_ = in_XMM8_Qb;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = this->dy;
              auVar39 = vfmadd132sd_fma(auVar63,auVar27,auVar4);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = auVar39._0_8_ * auVar39._0_8_;
              auVar14 = vfmadd231sd_fma(auVar64,auVar14,auVar14);
              auVar14 = vsqrtsd_avx(auVar14,auVar14);
              dVar42 = cos(dVar41 - phib);
              dVar42 = dVar42 * auVar14._0_8_;
              auVar25._8_8_ = uStack_c0;
              auVar25._0_8_ = local_c8;
              auVar28._8_8_ = uStack_b0;
              auVar28._0_8_ = local_b8;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = this->dx;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = dVar40;
              auVar14 = vfmadd132sd_fma(auVar45,auVar25,auVar5);
              auVar58._0_8_ = (double)(iVar35 - this->ny / 2);
              auVar58._8_8_ = in_XMM6_Qb;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = this->dy;
              auVar39 = vfmadd132sd_fma(auVar58,auVar28,auVar6);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = auVar39._0_8_ * auVar39._0_8_;
              auVar14 = vfmadd231sd_fma(auVar59,auVar14,auVar14);
              auVar14 = vsqrtsd_avx(auVar14,auVar14);
              local_108 = auVar14._0_8_;
              dVar41 = sin(dVar41 - phib);
              dVar41 = dVar41 * local_108;
              local_108 = (double)((int)lVar37 - this->nz / 2) * this->dz;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = dVar41;
              uStack_100 = 0;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = local_108 * local_108;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = dVar41;
              auVar14 = vfmadd231sd_fma(auVar46,auVar60,auVar61);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = dVar42;
              auVar31._8_8_ = uStack_40;
              auVar31._0_8_ = local_48;
              uVar15 = vcmppd_avx512vl(auVar18,auVar31,0xe);
              auVar14 = vsqrtsd_avx(auVar14,auVar14);
              dVar43 = auVar14._0_8_;
              auVar30._8_8_ = uStack_50;
              auVar30._0_8_ = local_58;
              uVar38 = vcmppd_avx512vl(auVar18,auVar30,1);
              uVar38 = ((byte)uVar15 & 3) & uVar38;
              if (((uVar38 & 1) != 0) && (dVar43 < local_f8)) {
                auVar39 = vunpcklpd_avx(auVar18,auVar14);
                auVar62._8_8_ = 0x3ff0000000000000;
                auVar62._0_8_ = 0x3ff0000000000000;
                auVar47._0_8_ = auVar39._0_8_ * auVar39._0_8_;
                auVar47._8_8_ = auVar39._8_8_ * auVar39._8_8_;
                auVar29._8_8_ = dStack_60;
                auVar29._0_8_ = local_68;
                auVar39 = vdivpd_avx(auVar47,auVar29);
                auVar1 = vsubpd_avx(auVar62,auVar39);
                auVar39 = vshufpd_avx(auVar1,auVar1,1);
                local_e8._0_8_ = auVar1._0_8_ * n0 * auVar39._0_8_;
                local_d8 = auVar14;
                local_80 = cos(phib);
                local_80 = local_80 * u0;
                dVar43 = sin(phib);
                fill_cell_by_particles
                          (this,local_88,&local_114,&local_78,(double)local_e8._0_8_,local_80,
                           dVar43 * u0,0.0,0.0);
                auVar14 = vpermilpd_avx(auVar47,1);
                dVar43 = auVar1._0_8_ * local_90 * (1.0 - auVar14._0_8_ / local_98);
                auVar48._0_8_ = sin(phib);
                auVar48._8_56_ = extraout_var;
                local_148._0_8_ = dVar43 * dVar65;
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar34][lVar36];
                local_148._8_8_ = 0;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)((long)&pcVar11->ex + lVar33);
                local_e8._8_8_ = 0;
                local_e8._0_8_ = (double)local_148._0_8_ * dVar41;
                auVar14 = vfnmadd213sd_fma(auVar48._0_16_,local_e8,auVar7);
                *(long *)((long)&pcVar11->ex + lVar33) = auVar14._0_8_;
                auVar49._0_8_ = cos(phib);
                auVar49._8_56_ = extraout_var_00;
                auVar21._8_8_ = uStack_100;
                auVar21._0_8_ = local_108;
                auVar14 = vunpcklpd_avx(local_e8,local_148);
                auVar39 = vunpcklpd_avx(auVar49._0_16_,auVar21);
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar34][lVar36];
                auVar14 = vfmadd213pd_fma(auVar39,auVar14,
                                          *(undefined1 (*) [16])((long)&pcVar11->ey + lVar33));
                *(undefined1 (*) [16])((long)&pcVar11->ey + lVar33) = auVar14;
                local_148._0_8_ = dVar43 * dVar13;
                local_148._8_8_ = 0;
                local_188._8_8_ = 0;
                local_188._0_8_ = local_108 * (double)local_148._0_8_;
                auVar50._0_8_ = sin(phib);
                auVar50._8_56_ = extraout_var_01;
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar34][lVar36];
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)((long)&pcVar12->bx + lVar33);
                auVar14 = vfmadd213sd_fma(auVar50._0_16_,local_188,auVar8);
                *(long *)((long)&pcVar12->bx + lVar33) = auVar14._0_8_;
                auVar51._0_8_ = cos(phib);
                auVar51._8_56_ = extraout_var_02;
                auVar14 = vunpcklpd_avx(auVar51._0_16_,auVar60);
                dVar43 = local_d8._0_8_;
                auVar16._8_8_ = 0x8000000000000000;
                auVar16._0_8_ = 0x8000000000000000;
                auVar39 = vxorpd_avx512vl(local_188,auVar16);
                auVar39 = vunpcklpd_avx(auVar39,local_148);
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar34][lVar36];
                auVar14 = vfmadd213pd_fma(auVar14,auVar39,
                                          *(undefined1 (*) [16])((long)&pcVar12->by + lVar33));
                *(undefined1 (*) [16])((long)&pcVar12->by + lVar33) = auVar14;
              }
              if ((local_f8 <= dVar43 & (byte)uVar38) == 1) {
                dVar42 = ((1.0 - (dVar42 * dVar42) / local_68) * local_a0 * local_f8 * local_f8) /
                         (dVar43 * dVar43);
                auVar52._0_8_ = sin(phib);
                auVar52._8_56_ = extraout_var_03;
                local_188._0_8_ = dVar42 * dVar65;
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar34][lVar36];
                local_188._8_8_ = 0;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *(ulong *)((long)&pcVar11->ex + lVar33);
                local_d8._8_8_ = 0;
                local_d8._0_8_ = (double)local_188._0_8_ * dVar41;
                auVar14 = vfnmadd213sd_fma(auVar52._0_16_,local_d8,auVar9);
                *(long *)((long)&pcVar11->ex + lVar33) = auVar14._0_8_;
                auVar53._0_8_ = cos(phib);
                auVar53._8_56_ = extraout_var_04;
                auVar22._8_8_ = uStack_100;
                auVar22._0_8_ = local_108;
                auVar14 = vunpcklpd_avx(local_d8,local_188);
                auVar39 = vunpcklpd_avx(auVar53._0_16_,auVar22);
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar34][lVar36];
                auVar14 = vfmadd213pd_fma(auVar39,auVar14,
                                          *(undefined1 (*) [16])((long)&pcVar11->ey + lVar33));
                *(undefined1 (*) [16])((long)&pcVar11->ey + lVar33) = auVar14;
                local_188._0_8_ = dVar42 * dVar13;
                local_188._8_8_ = 0;
                dVar42 = local_108 * (double)local_188._0_8_;
                auVar54._0_8_ = sin(phib);
                auVar54._8_56_ = extraout_var_05;
                auVar19._8_8_ = 0;
                auVar19._0_8_ = dVar42;
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar34][lVar36];
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)((long)&pcVar12->bx + lVar33);
                auVar14 = vfmadd213sd_fma(auVar54._0_16_,auVar19,auVar10);
                *(long *)((long)&pcVar12->bx + lVar33) = auVar14._0_8_;
                auVar55._0_8_ = cos(phib);
                auVar55._8_56_ = extraout_var_06;
                auVar20._8_8_ = 0;
                auVar20._0_8_ = dVar42;
                auVar14 = vunpcklpd_avx(auVar55._0_16_,auVar60);
                auVar17._8_8_ = 0x8000000000000000;
                auVar17._0_8_ = 0x8000000000000000;
                auVar39 = vxorpd_avx512vl(auVar20,auVar17);
                auVar39 = vunpcklpd_avx(auVar39,local_188);
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar34][lVar36];
                auVar14 = vfmadd213pd_fma(auVar14,auVar39,
                                          *(undefined1 (*) [16])((long)&pcVar12->by + lVar33));
                *(undefined1 (*) [16])((long)&pcVar12->by + lVar33) = auVar14;
              }
              uVar38 = (ulong)this->nz;
              lVar37 = lVar37 + 1;
              lVar33 = lVar33 + 0x18;
            } while (lVar37 < (long)uVar38);
            iVar32 = this->ny;
          }
          lVar36 = lVar36 + 1;
        } while (lVar36 < iVar32);
        iVar35 = this->nx;
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 < iVar35);
  }
  return;
}

Assistant:

void spatial_region::add_beam(double cmr, double n0, double u0, double xb, double rb, double x0b, double y0b, double phib)
{
    /* Добавляет электронный пучок с полями, вычисленными в
     * приближении бесконечного гамма-фактора пучка. n0 - максимальная
     * концентрация электронов в пучке, нормированная на критическую
     * концентрацию. phib - направление (в плоскости xy), в котором пучок распространяется
     */

    int_vector3d a,b;
    b.i = xnpic;
    b.j = ynpic;
    b.k = znpic;
    double x, y, z, r, n, f_ampl, signum, type, phi;
    signum = (u0>0) - (u0<0);
    type = (cmr>0)-(cmr<0);
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            for(int k=0; k<nz; k++)
            {
                a.i = i;
                a.j = j;
                a.k = k;
                phi = atan2((j-ny/2)*dy-y0b, i*dx-x0b);
                // x,y,z are in the rotated (by phib) coordinate system
                x = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * cos(phi - phib);
                y = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * sin(phi - phib);
                z = (k-nz/2)*dz;
                r = sqrt(y*y + z*z);
                if (x>-xb && x<xb && r<rb)
                {
                    n = n0*(1-x*x/(xb*xb))*(1-r*r/(rb*rb));
                    fill_cell_by_particles(cmr,a,b,n,u0*cos(phib),u0*sin(phib));
                    f_ampl = 0.5*n0*(1-x*x/(xb*xb))*(1-r*r/(2*rb*rb));
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
                if (x>-xb && x<xb && r>=rb)
                {
                    f_ampl = 0.25*n0*(1-x*x/(xb*xb))*rb*rb/(r*r);
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
            }
        }
    }
}